

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotArrayDebuggerScopeProperties
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,DebuggerScope *debuggerScope,
          uint propertiesCount)

{
  undefined4 id;
  undefined4 value;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  PropertyId value_00;
  uint32 uVar6;
  undefined4 *puVar7;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar8;
  Type *pTVar9;
  PropertyId PStack_44;
  PropertyId propertyId;
  DebuggerScopeProperty scopeProperty;
  uint i;
  uint32 size;
  uint propertiesCount_local;
  DebuggerScope *debuggerScope_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6d6,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (propertiesCount == 0) {
    this_local._4_4_ = 0;
  }
  else {
    scopeProperty.flags = 0;
    bVar2 = DebuggerScope::HasProperties(debuggerScope);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e2,"(debuggerScope->HasProperties())",
                                  "Properties should exist.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pLVar8 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&debuggerScope->scopeProperties);
    iVar3 = JsUtil::ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>::
            Count(&pLVar8->
                   super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
    ;
    if (iVar3 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e3,"(debuggerScope->scopeProperties->Count() >= 0)",
                                  "debuggerScope->scopeProperties->Count() >= 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pLVar8 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&debuggerScope->scopeProperties);
    uVar4 = JsUtil::ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>::
            Count(&pLVar8->
                   super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
    ;
    if (uVar4 != propertiesCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e4,
                                  "((uint)debuggerScope->scopeProperties->Count() == propertiesCount)"
                                  ,"Property counts should match.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    for (scopeProperty.byteCodeInitializationOffset = 0;
        (uint)scopeProperty.byteCodeInitializationOffset < propertiesCount;
        scopeProperty.byteCodeInitializationOffset = scopeProperty.byteCodeInitializationOffset + 1)
    {
      pLVar8 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&debuggerScope->scopeProperties);
      pTVar9 = JsUtil::
               List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar8,scopeProperty.byteCodeInitializationOffset);
      id = pTVar9->propId;
      value = pTVar9->location;
      uVar5 = PrependInt32(this,builder,L"SlotIndexesForDebuggerScopeSlots",value,
                           (BufferBuilderInt32 **)0x0);
      value_00 = encodePossiblyBuiltInPropertyId(this,id);
      uVar6 = PrependInt32(this,builder,L"PropertyIdsForDebuggerScopeSlots",value_00,
                           (BufferBuilderInt32 **)0x0);
      scopeProperty.flags = uVar6 + uVar5 + scopeProperty.flags;
    }
    this_local._4_4_ = scopeProperty.flags;
  }
  return this_local._4_4_;
}

Assistant:

uint32 AddSlotArrayDebuggerScopeProperties(BufferBuilderList & builder, DebuggerScope* debuggerScope, uint propertiesCount)
    {
        Assert(debuggerScope);
        if (propertiesCount == 0)
        {
            return 0u;
        }

        uint32 size = 0u;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotArrayDebuggerScopeProperties"), magicStartOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        AssertMsg(debuggerScope->HasProperties(), "Properties should exist.");
        Assert(debuggerScope->scopeProperties->Count() >= 0);
        AssertMsg((uint)debuggerScope->scopeProperties->Count() == propertiesCount, "Property counts should match.");
        for (uint i = 0u; i < propertiesCount; ++i)
        {
            DebuggerScopeProperty scopeProperty = debuggerScope->scopeProperties->Item(i);
            size += PrependInt32(builder, _u("SlotIndexesForDebuggerScopeSlots"), scopeProperty.location);

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(scopeProperty.propId);
            size += PrependInt32(builder, _u("PropertyIdsForDebuggerScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End SlotArrayDebuggerScopeProperties"), magicEndOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        return size;
    }